

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crc32c_inline.h
# Opt level: O0

bool absl::lts_20250127::crc_internal::ExtendCrc32cInline(uint32_t *crc,char *p,size_t n)

{
  size_t n_local;
  char *p_local;
  uint32_t *crc_local;
  
  return false;
}

Assistant:

inline bool ExtendCrc32cInline(uint32_t* crc, const char* p, size_t n) {
#if defined(ABSL_CRC_INTERNAL_HAVE_ARM_SIMD) || \
    defined(ABSL_CRC_INTERNAL_HAVE_X86_SIMD)
  constexpr uint32_t kCrc32Xor = 0xffffffffU;
  *crc ^= kCrc32Xor;
  if (n & 1) {
    *crc = CRC32_u8(*crc, static_cast<uint8_t>(*p));
    n--;
    p++;
  }
  if (n & 2) {
    *crc = CRC32_u16(*crc, absl::little_endian::Load16(p));
    n -= 2;
    p += 2;
  }
  if (n & 4) {
    *crc = CRC32_u32(*crc, absl::little_endian::Load32(p));
    n -= 4;
    p += 4;
  }
  while (n) {
    *crc = CRC32_u64(*crc, absl::little_endian::Load64(p));
    n -= 8;
    p += 8;
  }
  *crc ^= kCrc32Xor;
  return true;
#else
  // No hardware support, signal the need to fallback.
  static_cast<void>(crc);
  static_cast<void>(p);
  static_cast<void>(n);
  return false;
#endif  // defined(ABSL_CRC_INTERNAL_HAVE_ARM_SIMD) ||
        // defined(ABSL_CRC_INTERNAL_HAVE_X86_SIMD)
}